

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

string * __thiscall
ThreadTrackerItem::getAggrStackName_abi_cxx11_
          (string *__return_storage_ptr__,ThreadTrackerItem *this)

{
  allocator local_9;
  
  (this->aggrStackNameRaw).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[this->lenName] = '\0';
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (this->aggrStackNameRaw).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string getAggrStackName() {
        aggrStackNameRaw[lenName] = 0;
        return &aggrStackNameRaw[0];
    }